

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O2

bool __thiscall ON_Leader::Transform(ON_Leader *this,ON_Xform *xform)

{
  ON_Plane *this_00;
  uint uVar1;
  ON_NurbsCurve *pOVar2;
  ON_2dPoint *pOVar3;
  ON_3dPoint p;
  bool bVar4;
  int iVar5;
  ON_3dPoint *pOVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ON_3dPointArray pts;
  ON_3dPoint local_48;
  
  bVar4 = ON_Geometry::Transform((ON_Geometry *)this,xform);
  if (bVar4) {
    bVar4 = ON_Xform::IsTranslation(xform,0.0);
    if (bVar4) {
      bVar4 = ON_Plane::Transform(&(this->super_ON_Annotation).m_plane,xform);
    }
    else {
      uVar1 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count;
      ON_3dPointArray::ON_3dPointArray(&pts,uVar1 + 1);
      uVar7 = 0;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar7;
      }
      this_00 = &(this->super_ON_Annotation).m_plane;
      lVar10 = 8;
      for (; uVar9 * 0x18 - uVar7 != 0; uVar7 = uVar7 + 0x18) {
        pOVar3 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a;
        ON_Plane::PointAt(&local_48,this_00,*(double *)((long)pOVar3 + lVar10 + -8),
                          *(double *)((long)&pOVar3->x + lVar10));
        pOVar6 = ON_SimpleArray<ON_3dPoint>::AppendNew(&pts.super_ON_SimpleArray<ON_3dPoint>);
        pOVar6->z = local_48.z;
        pOVar6->x = local_48.x;
        pOVar6->y = local_48.y;
        ON_3dPoint::Transform
                  ((ON_3dPoint *)((long)&(pts.super_ON_SimpleArray<ON_3dPoint>.m_a)->x + uVar7),
                   xform);
        lVar10 = lVar10 + 0x10;
      }
      ON_2dPoint::operator=(&this->m_text_point,&ON_3dPoint::UnsetPoint);
      bVar4 = ON_Plane::Transform(this_00,xform);
      lVar10 = 8;
      for (lVar8 = 0; uVar9 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        pOVar3 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a;
        p.z = *(double *)((long)&(pts.super_ON_SimpleArray<ON_3dPoint>.m_a)->z + lVar8);
        p._0_16_ = *(undefined1 (*) [16])
                    ((long)&(pts.super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar8);
        ON_Plane::ClosestPointTo
                  (this_00,p,(double *)((long)pOVar3 + lVar10 + -8),
                   (double *)((long)&pOVar3->x + lVar10));
        lVar10 = lVar10 + 0x10;
      }
      ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&pts.super_ON_SimpleArray<ON_3dPoint>);
    }
    if (bVar4) {
      pOVar2 = this->m_curve;
      if (pOVar2 == (ON_NurbsCurve *)0x0) {
        return true;
      }
      iVar5 = (*(pOVar2->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x1c])
                        (pOVar2,xform);
      if ((char)iVar5 != '\0') {
        return true;
      }
      if (this->m_curve != (ON_NurbsCurve *)0x0) {
        (*(this->m_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
      this->m_curve = (ON_NurbsCurve *)0x0;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Leader::Transform(const ON_Xform& xform)
{
  bool rc = ON_Geometry::Transform(xform);
  if (rc)
  {
    if (xform.IsTranslation())
      rc = m_plane.Transform(xform);
    else
    {
      int cnt = m_points.Count();
      ON_3dPointArray pts(cnt+1);
      for (int i = 0; i < cnt; i++)
      {
        pts.AppendNew() = m_plane.PointAt(m_points[i].x, m_points[i].y);
        pts[i].Transform(xform);
      }
      m_text_point = ON_3dPoint::UnsetPoint;
      rc = m_plane.Transform(xform);
      for (int i = 0; i < cnt; i++)
        m_plane.ClosestPointTo(pts[i], &m_points[i].x, &m_points[i].y);
    }
  }
  if (rc && nullptr != m_curve && !m_curve->Transform(xform))
  {
    delete m_curve;
    m_curve = nullptr;
  }
  return rc;
}